

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SumBatches::forward_impl
          (SumBatches *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer ppTVar5;
  Tensor *pTVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Index dstCols;
  long lVar17;
  Index dstCols_1;
  PointerType pfVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint p_3;
  int iVar24;
  int iVar25;
  uint p_4;
  Index index_1;
  ulong uVar26;
  uint i;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  uint p_2;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> res;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> local_11d;
  uint local_11c;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_118;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_110;
  PointerType local_f0;
  ulong local_e8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_e0;
  DstEvaluatorType local_c0;
  undefined1 local_a8 [16];
  variable_if_dynamic<long,__1> local_98;
  float *local_90;
  variable_if_dynamic<long,__1> local_80;
  float *local_78;
  variable_if_dynamic<long,__1> local_68;
  float *local_60;
  variable_if_dynamic<long,__1> local_50;
  float *local_48;
  variable_if_dynamic<long,__1> local_38;
  
  ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_118 = xs;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 != 8) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,900,
                  "virtual void cnn::SumBatches::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar22 = ((*ppTVar5)->d).bd;
  Tensor::operator*(&local_110,fx);
  pfVar18 = local_110.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data;
  uVar33 = uVar22 & 3;
  local_11c = uVar22;
  switch(uVar33) {
  case 0:
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value |
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    uVar26 = local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar19 = uVar26;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar19 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3),
       (long)uVar26 <= (long)uVar19)) {
      uVar19 = uVar26;
    }
    uVar28 = uVar26 - uVar19;
    uVar27 = uVar28 + 3;
    if (-1 < (long)uVar28) {
      uVar27 = uVar28;
    }
    local_e8 = uVar27 & 0xfffffffffffffffc;
    if (0 < (long)uVar19) {
      memset(local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data,0,uVar19 * 4);
    }
    lVar29 = local_e8 + uVar19;
    if (3 < (long)uVar28) {
      local_f0 = pfVar18;
      lVar17 = uVar19 + 4;
      if ((long)(uVar19 + 4) < lVar29) {
        lVar17 = lVar29;
      }
      memset(pfVar18 + uVar19,0,(~uVar19 + lVar17 & 0xfffffffffffffffc) * 4 + 0x10);
      pfVar18 = local_f0;
    }
    if (lVar29 < (long)uVar26) {
      memset(pfVar18 + ((long)uVar27 >> 2) * 4 + uVar19,0,(uVar28 - local_e8) * 4);
    }
    break;
  case 1:
    pTVar6 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    local_a8._0_8_ = pTVar6->v;
    local_a8._8_8_ = ZEXT48((pTVar6->d).d[0]);
    local_98.m_value = 1;
    if (1 < (pTVar6->d).nd) {
      local_98.m_value = (long)(pTVar6->d).d[1];
    }
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
    ::operator=(&local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                ,(MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  *)local_a8);
    break;
  case 2:
    pTVar6 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar19 = (ulong)(pTVar6->d).d[0];
    uVar22 = (pTVar6->d).nd;
    if ((ulong)uVar22 == 0) {
      uVar21 = (pTVar6->d).bd;
      uVar20 = 1;
      uVar26 = 1;
    }
    else {
      uVar23 = (pTVar6->d).d[1];
      uVar21 = (pTVar6->d).bd;
      uVar20 = 1;
      uVar26 = 0;
      do {
        uVar20 = uVar20 * (pTVar6->d).d[uVar26];
        uVar26 = uVar26 + 1;
      } while (uVar22 != uVar26);
      if (uVar22 == 1) {
        uVar23 = 1;
      }
      uVar26 = (ulong)uVar23;
    }
    uVar27 = 0;
    if (uVar21 != 1) {
      uVar27 = (ulong)uVar20;
    }
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != uVar19) ||
       (local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar26)) {
LAB_001a457d:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                   );
    }
    pfVar7 = pTVar6->v;
    uVar26 = uVar26 * uVar19;
    uVar19 = uVar26;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar19 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3), uVar26 <= uVar19)) {
      uVar19 = uVar26;
    }
    uVar31 = uVar26 - uVar19;
    uVar28 = uVar31 + 3;
    if (-1 < (long)uVar31) {
      uVar28 = uVar31;
    }
    if (uVar19 != 0) {
      uVar32 = 0;
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar32] = pfVar7[uVar32] + pfVar7[uVar27 + uVar32];
        uVar32 = uVar32 + 1;
      } while (uVar19 != uVar32);
    }
    lVar29 = (uVar28 & 0xfffffffffffffffc) + uVar19;
    if (3 < (long)uVar31) {
      do {
        pfVar1 = pfVar7 + uVar19;
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar2 = pfVar7 + uVar27 + uVar19;
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar19;
        *pfVar3 = *pfVar2 + *pfVar1;
        pfVar3[1] = fVar11 + fVar8;
        pfVar3[2] = fVar12 + fVar9;
        pfVar3[3] = fVar13 + fVar10;
        uVar19 = uVar19 + 4;
      } while ((long)uVar19 < lVar29);
    }
    if (lVar29 < (long)uVar26) {
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar29] = pfVar7[lVar29] + pfVar7[uVar27 + lVar29];
        lVar29 = lVar29 + 1;
      } while (uVar26 - lVar29 != 0);
    }
    break;
  case 3:
    pTVar6 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar26 = (ulong)(pTVar6->d).d[0];
    uVar22 = (pTVar6->d).nd;
    uVar19 = (ulong)uVar22;
    if (uVar19 == 0) {
      uVar21 = (pTVar6->d).bd;
      uVar27 = (ulong)(uVar21 != 1);
      iVar30 = 1;
      uVar19 = 1;
    }
    else {
      if (uVar22 != 1) {
        uVar22 = (pTVar6->d).d[1];
      }
      uVar21 = (pTVar6->d).bd;
      uVar20 = 1;
      uVar27 = 0;
      do {
        uVar20 = uVar20 * (pTVar6->d).d[uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar19 != uVar27);
      uVar28 = 0;
      uVar27 = (ulong)uVar20;
      if (uVar21 == 1) {
        uVar27 = uVar28;
      }
      iVar30 = 1;
      do {
        iVar30 = iVar30 * (pTVar6->d).d[uVar28];
        uVar28 = uVar28 + 1;
      } while (uVar19 != uVar28);
      uVar19 = (ulong)uVar22;
    }
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != uVar26) ||
       (local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar19)) goto LAB_001a457d;
    pfVar7 = pTVar6->v;
    uVar22 = (int)(2 % (ulong)uVar21) * iVar30;
    uVar19 = uVar19 * uVar26;
    uVar26 = uVar19;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar26 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3), uVar19 <= uVar26)) {
      uVar26 = uVar19;
    }
    uVar31 = uVar19 - uVar26;
    uVar28 = uVar31 + 3;
    if (-1 < (long)uVar31) {
      uVar28 = uVar31;
    }
    if (uVar26 != 0) {
      uVar32 = 0;
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar32] = pfVar7[uVar32] + pfVar7[uVar27 + uVar32] + pfVar7[uVar22 + uVar32];
        uVar32 = uVar32 + 1;
      } while (uVar26 != uVar32);
    }
    lVar29 = (uVar28 & 0xfffffffffffffffc) + uVar26;
    if (3 < (long)uVar31) {
      do {
        pfVar1 = pfVar7 + uVar26;
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar2 = pfVar7 + uVar27 + uVar26;
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = pfVar7 + uVar22 + uVar26;
        fVar14 = pfVar3[1];
        fVar15 = pfVar3[2];
        fVar16 = pfVar3[3];
        pfVar4 = local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar26;
        *pfVar4 = *pfVar3 + *pfVar2 + *pfVar1;
        pfVar4[1] = fVar14 + fVar11 + fVar8;
        pfVar4[2] = fVar15 + fVar12 + fVar9;
        pfVar4[3] = fVar16 + fVar13 + fVar10;
        uVar26 = uVar26 + 4;
      } while ((long)uVar26 < lVar29);
    }
    if (lVar29 < (long)uVar19) {
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar29] = pfVar7[lVar29] + pfVar7[uVar27 + lVar29] + pfVar7[(ulong)uVar22 + lVar29];
        lVar29 = lVar29 + 1;
      } while (uVar19 - lVar29 != 0);
    }
  }
  if (3 < local_11c) {
    do {
      pTVar6 = *(local_118->
                super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar22 = (pTVar6->d).nd;
      uVar19 = (ulong)uVar22;
      iVar30 = 1;
      if (uVar19 != 0) {
        uVar26 = 0;
        do {
          iVar30 = iVar30 * (pTVar6->d).d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
      }
      local_48 = pTVar6->v;
      uVar21 = (pTVar6->d).bd;
      uVar20 = (pTVar6->d).d[1];
      if (uVar22 < 2) {
        uVar20 = 1;
      }
      local_80.m_value = (long)(pTVar6->d).d[0];
      if (uVar19 == 0) {
        uVar22 = (uVar33 + 1) % uVar21;
        uVar23 = (uVar33 + 2) % uVar21;
        iVar24 = 1;
      }
      else {
        iVar24 = 1;
        uVar26 = 0;
        do {
          iVar24 = iVar24 * (pTVar6->d).d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
        uVar22 = ((uVar33 + 1) % uVar21) * iVar24;
        iVar25 = 1;
        uVar26 = 0;
        do {
          iVar25 = iVar25 * (pTVar6->d).d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
        iVar24 = 1;
        uVar26 = 0;
        do {
          iVar24 = iVar24 * (pTVar6->d).d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
        uVar23 = ((uVar33 + 2) % uVar21) * iVar25;
      }
      local_90 = local_48 + (uVar33 % uVar21) * iVar30;
      local_78 = local_48 + uVar22;
      local_60 = local_48 + uVar23;
      local_48 = local_48 + ((uVar33 + 3) % uVar21) * iVar24;
      local_68.m_value = local_80.m_value;
      local_50.m_value = local_80.m_value;
      local_38.m_value = local_80.m_value;
      if ((local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != local_80.m_value) ||
         (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != (ulong)uVar20)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_110.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_e0.m_dst = &local_c0;
      local_e0.m_src = (SrcEvaluatorType *)local_a8;
      local_e0.m_functor = &local_11d;
      local_e0.m_dstExpr = &local_110;
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value = local_80.m_value;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run(&local_e0);
      uVar33 = uVar33 + 4;
    } while (uVar33 < local_11c);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}